

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O2

int VP8EncAnalyze(VP8Encoder *enc)

{
  VP8MBInfo *pVVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  WebPWorkerInterface *pWVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  void *ptr;
  int iVar10;
  void *pvVar11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  uint64_t nmemb;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  undefined1 local_2728 [16];
  int centers [4];
  int aiStack_26e8 [4];
  int accum [4];
  SegmentJob local_26c0;
  SegmentJob side_job;
  
  if (((enc->config_->emulate_jpeg_size == 0) && ((enc->segment_hdr_).num_segments_ < 2)) &&
     (1 < enc->method_)) {
    for (lVar7 = 0; lVar7 < (long)enc->mb_h_ * (long)enc->mb_w_; lVar7 = lVar7 + 1) {
      pVVar1 = enc->mb_info_;
      *(byte *)(pVVar1 + lVar7) = (*(byte *)(pVVar1 + lVar7) & 0x80) + 1;
      pVVar1[lVar7].alpha_ = '\0';
    }
    enc->dqm_[0].alpha_ = 0;
    enc->dqm_[0].beta_ = 0;
    enc->alpha_ = 0;
    enc->uv_alpha_ = 0;
    WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
    iVar5 = 1;
  }
  else {
    iVar5 = enc->mb_h_;
    iVar25 = enc->mb_w_ * iVar5;
    iVar23 = enc->thread_level_;
    pWVar6 = WebPGetWorkerInterface();
    if ((iVar23 < 1) || (iVar23 = iVar5 * 9 + 0xf >> 4, iVar23 < 2)) {
      InitSegmentJob(enc,&local_26c0,0,iVar5);
      (*pWVar6->Execute)(&local_26c0.worker);
      uVar13 = (*pWVar6->Sync)(&local_26c0.worker);
      uVar13 = uVar13 & 1;
    }
    else {
      uVar13 = 0;
      InitSegmentJob(enc,&local_26c0,0,iVar23);
      InitSegmentJob(enc,&side_job,iVar23,iVar5);
      uVar2 = (*pWVar6->Reset)(&side_job.worker);
      if ((uVar2 & 1) != 0) {
        (*pWVar6->Launch)(&side_job.worker);
        (*pWVar6->Execute)(&local_26c0.worker);
        uVar13 = (*pWVar6->Sync)(&side_job.worker);
        uVar2 = (*pWVar6->Sync)(&local_26c0.worker);
        uVar13 = uVar2 & uVar13 & 1;
      }
      (*pWVar6->End)(&side_job.worker);
      if (uVar13 != 0) {
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          local_26c0.alphas[lVar7] = local_26c0.alphas[lVar7] + side_job.alphas[lVar7];
        }
        iVar5 = local_26c0.uv_alpha;
        local_26c0.alpha = local_26c0.alpha + side_job.alpha;
        local_26c0.uv_alpha = iVar5 + side_job.uv_alpha;
      }
    }
    (*pWVar6->End)(&local_26c0.worker);
    if (uVar13 == 0) {
      iVar5 = WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    else {
      enc->alpha_ = local_26c0.alpha / iVar25;
      enc->uv_alpha_ = local_26c0.uv_alpha / iVar25;
      uVar13 = (enc->segment_hdr_).num_segments_;
      uVar16 = 4;
      if ((int)uVar13 < 4) {
        uVar16 = (ulong)uVar13;
      }
      for (uVar8 = 0; uVar8 != 0x100; uVar8 = uVar8 + 1) {
        if (local_26c0.alphas[uVar8] != 0) goto LAB_001293a8;
      }
      uVar8 = 0x100;
LAB_001293a8:
      iVar5 = (int)uVar8;
      uVar22 = 0xff;
      if (iVar5 < 0xff) {
        uVar22 = uVar8 & 0xffffffff;
      }
      for (uVar9 = 0xff; (uVar8 & 0xffffffff) < uVar9; uVar9 = uVar9 - 1) {
        if (local_26c0.alphas[uVar9] != 0) {
          uVar22 = uVar9 & 0xffffffff;
          break;
        }
      }
      iVar23 = (int)uVar22 - iVar5;
      uVar19 = 0;
      iVar25 = (int)uVar16;
      uVar9 = 0;
      if (0 < iVar25) {
        uVar9 = uVar16;
      }
      for (; uVar9 != uVar19; uVar19 = uVar19 + 1) {
        centers[uVar19] = iVar23 / (iVar25 * 2) + iVar5;
        iVar23 = iVar23 + (int)uVar22 * 2 + iVar5 * -2;
      }
      iVar5 = 0;
      iVar23 = 0;
      do {
        if (iVar5 == 6) break;
        for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
          accum[uVar16] = 0;
          aiStack_26e8[uVar16] = 0;
        }
        iVar23 = 0;
        for (uVar16 = uVar8 & 0xffffffff; uVar16 <= uVar22; uVar16 = uVar16 + 1) {
          iVar15 = local_26c0.alphas[uVar16];
          if (iVar15 != 0) {
            lVar7 = (long)iVar23 << 0x20;
            lVar29 = (long)iVar23;
            iVar27 = iVar23;
            do {
              iVar23 = iVar27;
              lVar20 = lVar7;
              lVar17 = lVar29 + 1;
              iVar3 = (int)uVar16;
              if (iVar25 <= lVar17) break;
              uVar14 = iVar3 - centers[lVar17];
              uVar2 = -uVar14;
              if (0 < (int)uVar14) {
                uVar2 = uVar14;
              }
              uVar26 = iVar3 - centers[lVar29];
              uVar14 = -uVar26;
              if (0 < (int)uVar26) {
                uVar14 = uVar26;
              }
              lVar7 = lVar20 + 0x100000000;
              lVar29 = lVar17;
              iVar27 = iVar23 + 1;
            } while (uVar2 < uVar14);
            lVar20 = lVar20 >> 0x1e;
            piVar12 = (int *)((long)aiStack_26e8 + lVar20);
            *piVar12 = *piVar12 + iVar15 * iVar3;
            side_job.alphas[uVar16 - 0xc] = iVar23;
            piVar12 = (int *)((long)accum + lVar20);
            *piVar12 = *piVar12 + iVar15;
          }
        }
        iVar23 = 0;
        iVar27 = 0;
        iVar15 = 0;
        for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
          iVar3 = accum[uVar16];
          if (iVar3 != 0) {
            iVar4 = (iVar3 / 2 + aiStack_26e8[uVar16]) / iVar3;
            iVar10 = centers[uVar16] - iVar4;
            iVar18 = -iVar10;
            if (0 < iVar10) {
              iVar18 = iVar10;
            }
            iVar27 = iVar27 + iVar18;
            centers[uVar16] = iVar4;
            iVar15 = iVar15 + iVar4 * iVar3;
            iVar23 = iVar23 + iVar3;
          }
        }
        iVar23 = (iVar23 / 2 + iVar15) / iVar23;
        iVar5 = iVar5 + 1;
      } while (4 < iVar27);
      lVar7 = 0;
      while( true ) {
        uVar2 = enc->mb_w_;
        lVar29 = (long)(int)uVar2;
        iVar5 = enc->mb_h_;
        nmemb = iVar5 * lVar29;
        if ((long)nmemb <= lVar7) break;
        pVVar1 = enc->mb_info_;
        iVar5 = side_job.alphas[(ulong)pVVar1[lVar7].alpha_ - 0xc];
        *(byte *)(pVVar1 + lVar7) = *(byte *)(pVVar1 + lVar7) & 0x9f | ((byte)iVar5 & 3) << 5;
        pVVar1[lVar7].alpha_ = (uint8_t)centers[iVar5];
        lVar7 = lVar7 + 1;
      }
      if ((1 < (int)uVar13) && ((enc->config_->preprocessing & 1) != 0)) {
        lVar7 = 1;
        ptr = WebPSafeMalloc(nmemb,1);
        if (ptr != (void *)0x0) {
          lVar17 = (long)iVar5 + -1;
          for (; lVar20 = 1, lVar7 < lVar17; lVar7 = lVar7 + 1) {
            for (; lVar20 < lVar29 + -1; lVar20 = lVar20 + 1) {
              local_2728 = (undefined1  [16])0x0;
              lVar21 = lVar20 + lVar7 * lVar29;
              pVVar1 = enc->mb_info_ + lVar21;
              bVar24 = *(byte *)pVVar1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)~uVar2) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)~uVar2) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + -lVar29) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + -lVar29) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)(1 - uVar2)) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + (int)(1 - uVar2)) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + lVar29 + -1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + lVar29 + -1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + lVar29) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + lVar29) >> 3 & 0xc)) + 1;
              bVar24 = bVar24 >> 5 & 3;
              *(int *)(local_2728 + (*(byte *)(pVVar1 + lVar29 + 1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar1 + lVar29 + 1) >> 3 & 0xc)) + 1;
              for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
                if (4 < centers[lVar28 + -4]) {
                  bVar24 = (byte)lVar28;
                  break;
                }
              }
              *(byte *)((long)ptr + lVar21) = bVar24;
            }
          }
          lVar7 = lVar29 * 4;
          pvVar11 = ptr;
          for (lVar20 = 1; pvVar11 = (void *)((long)pvVar11 + lVar29), lVar21 = 1, lVar20 < lVar17;
              lVar20 = lVar20 + 1) {
            for (; lVar21 < lVar29 + -1; lVar21 = lVar21 + 1) {
              (&enc->mb_info_[lVar21].field_0x0)[lVar7] =
                   (&enc->mb_info_[lVar21].field_0x0)[lVar7] & 0x9f |
                   (*(byte *)((long)pvVar11 + lVar21) & 3) << 5;
            }
            lVar7 = lVar7 + lVar29 * 4;
          }
          WebPSafeFree(ptr);
        }
      }
      uVar13 = (enc->segment_hdr_).num_segments_;
      iVar25 = centers[0];
      if (1 < (int)uVar13) {
        for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          iVar5 = centers[uVar16];
          if (iVar5 <= iVar25) {
            iVar25 = iVar5;
          }
          if (centers[0] <= iVar5) {
            centers[0] = iVar5;
          }
        }
      }
      iVar5 = 1;
      iVar15 = iVar25 + 1;
      if (centers[0] != iVar25) {
        iVar15 = centers[0];
      }
      piVar12 = &enc->dqm_[0].beta_;
      for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
        iVar27 = ((centers[uVar16] - iVar23) * 0xff) / (iVar15 - iVar25);
        iVar3 = ((centers[uVar16] - iVar25) * 0xff) / (iVar15 - iVar25);
        if (0x7e < iVar27) {
          iVar27 = 0x7f;
        }
        if (iVar27 < -0x7e) {
          iVar27 = -0x7f;
        }
        piVar12[-1] = iVar27;
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        *piVar12 = iVar3;
        piVar12 = piVar12 + 0xba;
      }
    }
  }
  return iVar5;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config_->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr_.num_segments_ > 1) ||
      (enc->method_ <= 1);  // for method 0 - 1, we need preds_[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h_;
    const int total_mb = last_row * enc->mb_w_;
#ifdef WEBP_USE_THREAD
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level_ > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
#ifdef WEBP_USE_THREAD
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
#endif  // WEBP_USE_THREAD
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha_ = main_job.alpha / total_mb;
      enc->uv_alpha_ = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  if (!ok) {
    return WebPEncodingSetError(enc->pic_,
                                VP8_ENC_ERROR_OUT_OF_MEMORY);  // imprecise
  }
  return ok;
}